

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O3

int evutil_secure_rng_set_urandom_device_file(char *fname)

{
  char *pcVar1;
  
  pcVar1 = fname;
  if ((arc4rand_lock != (void *)0x0) &&
     ((*evthread_lock_fns_.lock)(0,arc4rand_lock), pcVar1 = fname, arc4rand_lock != (void *)0x0)) {
    arc4random_urandom_filename = fname;
    (*evthread_lock_fns_.unlock)(0,arc4rand_lock);
    pcVar1 = arc4random_urandom_filename;
  }
  arc4random_urandom_filename = pcVar1;
  return 0;
}

Assistant:

int
evutil_secure_rng_set_urandom_device_file(char *fname)
{
#ifdef TRY_SEED_URANDOM
	ARC4_LOCK_();
	arc4random_urandom_filename = fname;
	ARC4_UNLOCK_();
#endif
	return 0;
}